

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res012.c
# Opt level: O1

vorbis_info_residue * res0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int iVar2;
  long *__s;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  vorbis_info_residue0 *info;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  __s = (long *)calloc(1,0x520);
  pvVar1 = vi->codec_setup;
  lVar3 = oggpack_read(opb,0x18);
  *__s = lVar3;
  lVar3 = oggpack_read(opb,0x18);
  __s[1] = lVar3;
  lVar3 = oggpack_read(opb,0x18);
  *(int *)(__s + 2) = (int)lVar3 + 1;
  lVar3 = oggpack_read(opb,6);
  uVar9 = (uint)lVar3 + 1;
  *(uint *)((long)__s + 0x14) = uVar9;
  lVar4 = oggpack_read(opb,8);
  *(int *)(__s + 3) = (int)lVar4;
  uVar7 = 0;
  if ((uint)lVar3 < 0x7fffffff) {
    uVar10 = 0;
    uVar7 = 0;
    do {
      uVar5 = oggpack_read(opb,3);
      lVar3 = oggpack_read(opb,1);
      if (lVar3 != 0) {
        lVar3 = oggpack_read(opb,5);
        uVar5 = uVar5 | lVar3 << 3;
      }
      *(int *)((long)__s + uVar10 * 4 + 0x1c) = (int)uVar5;
      iVar2 = 0;
      if ((int)uVar5 != 0) {
        uVar6 = uVar5 & 0xffffffff;
        do {
          uVar8 = (uint)uVar5;
          iVar2 = iVar2 + (uVar8 & 1);
          uVar6 = uVar6 >> 1;
          uVar5 = uVar6;
        } while (1 < uVar8);
      }
      uVar7 = uVar7 + iVar2;
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar9);
  }
  if (0 < (int)uVar7) {
    uVar10 = 0;
    do {
      lVar3 = oggpack_read(opb,8);
      *(int *)((long)__s + uVar10 * 4 + 0x11c) = (int)lVar3;
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  iVar2 = *(int *)((long)pvVar1 + 0x24);
  if ((int)lVar4 < iVar2) {
    if (0 < (int)uVar7) {
      uVar10 = 0;
      do {
        if (iVar2 <= *(int *)((long)__s + uVar10 * 4 + 0x11c)) goto LAB_00131488;
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
  }
  else {
LAB_00131488:
    memset(__s,0,0x520);
    free(__s);
    __s = (long *)0x0;
  }
  return __s;
}

Assistant:

vorbis_info_residue *res0_unpack(vorbis_info *vi,oggpack_buffer *opb){
  int j,acc=0;
  vorbis_info_residue0 *info=(vorbis_info_residue0 *)_ogg_calloc(1,sizeof(*info));
  codec_setup_info     *ci=(codec_setup_info *)vi->codec_setup;

  info->begin=oggpack_read(opb,24);
  info->end=oggpack_read(opb,24);
  info->grouping=oggpack_read(opb,24)+1;
  info->partitions=oggpack_read(opb,6)+1;
  info->groupbook=oggpack_read(opb,8);

  for(j=0;j<info->partitions;j++){
    int cascade=oggpack_read(opb,3);
    if(oggpack_read(opb,1))
      cascade|=(oggpack_read(opb,5)<<3);
    info->secondstages[j]=cascade;

    acc+=icount(cascade);
  }
  for(j=0;j<acc;j++)
    info->booklist[j]=oggpack_read(opb,8);

  if(info->groupbook>=ci->books)goto errout;
  for(j=0;j<acc;j++)
    if(info->booklist[j]>=ci->books)goto errout;

  return(info);
 errout:
  res0_free_info(info);
  return(NULL);
}